

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool change_extension_u8(char *path,char *ext,char *dest)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  char fname [260];
  char dir [260];
  char drive [260];
  char *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  char *in_stack_fffffffffffffcb0;
  char local_348 [272];
  char local_238 [272];
  char local_128 [264];
  char *local_20;
  char *local_18;
  long local_10;
  _Bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  clear_path_string(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
  if (((local_10 == 0) || (local_18 == (char *)0x0)) || (local_20 == (char *)0x0)) {
    local_1 = false;
  }
  else {
    split_path(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98,(char *)0x195586);
    sVar1 = strlen(local_128);
    sVar2 = strlen(local_238);
    lVar3 = sVar1 + sVar2;
    sVar1 = strlen(local_348);
    lVar3 = lVar3 + sVar1;
    sVar1 = strlen(local_18);
    if (lVar3 + sVar1 + 1 < 0x105) {
      pcVar4 = strcpy(local_20,local_128);
      pcVar4 = strcat(pcVar4,local_238);
      pcVar4 = strcat(pcVar4,local_348);
      strcat(pcVar4,local_18);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool change_extension_u8(const char *path, const char *ext, char *dest)
{
	clear_path_string(dest, MAX_PATH);
	if (path == NULL || ext == NULL || dest == NULL)
	{
		return false;
	}
	char drive[MAX_PATH];
	char dir[MAX_PATH];
	char fname[MAX_PATH];
	split_path(path, drive, dir, fname, NULL);
	if (strlen(drive) + strlen(dir) + strlen(fname) + strlen(ext) + 1 > MAX_PATH)
	{
		return false;
	}
	strcat(strcat(strcat(strcpy(dest, drive), dir), fname), ext);
	return true;
}